

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_connect(connectdata *conn,_Bool *done)

{
  Curl_easy *pCVar1;
  _Bool _Var2;
  CURLcode CVar3;
  undefined4 local_a8;
  undefined1 local_a4;
  Curl_send_buffer *req_buffer;
  char proxy_header [128];
  
  Curl_conncontrol(conn,0);
  CVar3 = Curl_proxy_connect(conn,0);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  if (((conn->bits).field_0x6 & 0x80) != 0) {
    return CURLE_OK;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     ((conn->bits).proxy_ssl_connected[0] != true)) {
    return CURLE_OK;
  }
  _Var2 = Curl_connect_ongoing(conn);
  if (_Var2) {
    return CURLE_OK;
  }
  pCVar1 = conn->data;
  if (((pCVar1->set).field_0x87e & 0x10) != 0) {
    if (((conn->bits).field_0x5 & 4) == 0) {
      local_a8 = 0x34504354;
    }
    else {
      local_a8 = 0x36504354;
    }
    local_a4 = 0;
    curl_msnprintf(proxy_header,0x80,"PROXY %s %s %s %li %li\r\n",&local_a8,
                   (pCVar1->info).conn_local_ip,(pCVar1->info).conn_primary_ip,
                   (pCVar1->info).conn_local_port);
    req_buffer = (Curl_send_buffer *)(*Curl_ccalloc)(1,0x18);
    if (req_buffer == (Curl_send_buffer *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar3 = Curl_add_bufferf(&req_buffer,proxy_header);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_add_buffer_send(&req_buffer,conn,&(conn->data->info).request_size,0,0);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
  }
  if ((conn->given->protocol & 2) == 0) {
    *done = true;
    return CURLE_OK;
  }
  CVar3 = https_connecting(conn,done);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_connect(struct connectdata *conn, bool *done)
{
  CURLcode result;

  /* We default to persistent connections. We set this already in this connect
     function to make the re-use checks properly be able to check this bit. */
  connkeep(conn, "HTTP default");

  /* the CONNECT procedure might not have been completed */
  result = Curl_proxy_connect(conn, FIRSTSOCKET);
  if(result)
    return result;

  if(conn->bits.proxy_connect_closed)
    /* this is not an error, just part of the connection negotiation */
    return CURLE_OK;

  if(CONNECT_FIRSTSOCKET_PROXY_SSL())
    return CURLE_OK; /* wait for HTTPS proxy SSL initialization to complete */

  if(Curl_connect_ongoing(conn))
    /* nothing else to do except wait right now - we're not done here. */
    return CURLE_OK;

#ifndef CURL_DISABLE_PROXY
  if(conn->data->set.haproxyprotocol) {
    /* add HAProxy PROXY protocol header */
    result = add_haproxy_protocol_header(conn);
    if(result)
      return result;
  }
#endif

  if(conn->given->protocol & CURLPROTO_HTTPS) {
    /* perform SSL initialization */
    result = https_connecting(conn, done);
    if(result)
      return result;
  }
  else
    *done = TRUE;

  return CURLE_OK;
}